

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall
TPZSkylMatrix<double>::Decompose_LDLt
          (TPZSkylMatrix<double> *this,list<long,_std::allocator<long>_> *singular)

{
  _List_node_base *p_Var1;
  double **ppdVar2;
  size_t *psVar3;
  char cVar4;
  double **ppdVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  long lVar8;
  double *pdVar9;
  _List_node_base *p_Var10;
  long lVar11;
  _List_node_base *p_Var12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  _List_node_base *p_Var18;
  long lVar19;
  long lVar20;
  double *pdVar21;
  double dVar22;
  double extraout_XMM0_Qa;
  long local_78;
  long local_70;
  long local_68;
  
  cVar4 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed;
  if (cVar4 != '\0') {
    if (cVar4 == '\x04') {
      return 1;
    }
    TPZMatrix<double>::Error
              ("virtual int TPZSkylMatrix<double>::Decompose_LDLt(std::list<int64_t> &) [TVar = double]"
               ,"Decompose_LDLt <Matrix already Decomposed with different decomposition>");
  }
  std::__cxx11::list<long,_std::allocator<long>_>::clear(singular);
  iVar7 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(this);
  if (1 < CONCAT44(extraout_var,iVar7)) {
    lVar16 = 1;
    local_68 = 2;
    local_70 = 3;
    lVar17 = 8;
    local_78 = 0x10;
    do {
      ppdVar5 = (this->fElem).fStore;
      lVar8 = (long)ppdVar5[lVar16 + 1] - (long)ppdVar5[lVar16] >> 3;
      if (0 < lVar8) {
        p_Var18 = (_List_node_base *)((lVar16 - lVar8) + 1);
        lVar11 = local_68 - lVar8;
        lVar19 = local_70 - lVar8;
        lVar8 = local_78 + lVar8 * -8;
        p_Var10 = p_Var18;
        do {
          ppdVar5 = (this->fElem).fStore;
          pdVar9 = ppdVar5[(long)p_Var10];
          lVar13 = (long)ppdVar5[(long)((long)&p_Var10->_M_next + 1)] - (long)pdVar9 >> 3;
          p_Var1 = (_List_node_base *)((long)&p_Var10->_M_next + 1);
          p_Var12 = (_List_node_base *)((long)p_Var1 - lVar13);
          if ((long)p_Var12 < (long)p_Var18) {
            p_Var12 = p_Var18;
          }
          if ((long)p_Var12 < (long)p_Var10) {
            lVar13 = lVar19 - lVar13;
            lVar15 = lVar13;
            if (lVar13 < lVar11) {
              lVar15 = lVar11;
            }
            lVar20 = (long)ppdVar5[lVar16] + lVar17;
            lVar14 = (long)pdVar9 + lVar8;
            dVar22 = 0.0;
            do {
              ppdVar2 = ppdVar5 + (long)p_Var12;
              p_Var12 = (_List_node_base *)((long)&p_Var12->_M_next + 1);
              dVar22 = dVar22 + *(double *)(lVar20 + lVar15 * -8) *
                                *(double *)(lVar14 + lVar15 * -8) * **ppdVar2;
              lVar20 = lVar20 + -8;
              lVar14 = lVar14 + -8;
            } while ((long)p_Var12 < (long)p_Var10);
            if (lVar13 < lVar11) {
              lVar13 = lVar11;
            }
            pdVar21 = (double *)(lVar20 + lVar13 * -8);
          }
          else {
            pdVar21 = ppdVar5[lVar16] + (lVar16 - (long)p_Var12);
            pdVar9 = pdVar9 + ((long)p_Var10 - (long)p_Var12);
            dVar22 = 0.0;
          }
          dVar22 = *pdVar21 - dVar22;
          *pdVar21 = dVar22;
          if (pdVar9 == pdVar21) {
            if (ABS(dVar22) < 1e-12) {
              p_Var12 = (_List_node_base *)operator_new(0x18);
              p_Var12[1]._M_next = p_Var10;
              std::__detail::_List_node_base::_M_hook(p_Var12);
              psVar3 = &(singular->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node.
                        _M_size;
              *psVar3 = *psVar3 + 1;
              dVar22 = 1.0;
              goto LAB_00cbc79f;
            }
          }
          else {
            dVar22 = dVar22 / *pdVar9;
LAB_00cbc79f:
            *pdVar21 = dVar22;
          }
          lVar19 = lVar19 + 1;
          lVar8 = lVar8 + 8;
          bVar6 = (long)p_Var10 < lVar16;
          p_Var10 = p_Var1;
        } while (bVar6);
      }
      lVar16 = lVar16 + 1;
      local_68 = local_68 + 1;
      local_70 = local_70 + 1;
      lVar17 = lVar17 + 8;
      local_78 = local_78 + 8;
    } while (lVar16 != CONCAT44(extraout_var,iVar7));
  }
  lVar16 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar16 != 0) &&
     ((*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24])
                (this,lVar16 + -1), ABS(extraout_XMM0_Qa) < 1e-12)) {
    lVar16 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    p_Var10 = (_List_node_base *)operator_new(0x18);
    p_Var10[1]._M_next = (_List_node_base *)(lVar16 + -1);
    std::__detail::_List_node_base::_M_hook(p_Var10);
    psVar3 = &(singular->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
    *psVar3 = *psVar3 + 1;
    (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x23])
              (this,(this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + -1);
  }
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\x04';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\0';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_LDLt(std::list<int64_t> &singular)
{
    if( this->fDecomposed == ELDLt) return 1;
    if ( this->fDecomposed )
    {
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_LDLt <Matrix already Decomposed with different decomposition>" );
    }
    
#ifdef DUMP_BEFORE_DECOMPOSE
    dump_matrix(this, "TPZSkylMatrix::Decompose_LDLt(singular)");
#endif
    
    singular.clear();
    
    // Third try
    TVar *elj,*ell;
    int64_t j,l,minj,minl,minrow,dimension = this->Dim();
    TVar sum;
    j = 1;
    while(j < dimension) {
        minj = j-Size(j)+1;
        l = minj;
        while(l <= j) {
            minl = l-Size(l)+1;
            minrow = (minj<minl)? minl:minj;
            int64_t k = minrow;
            //			DiagkPtr = fDiag+minrow;
            elj = fElem[j]+j-minrow;
            ell = fElem[l]+l-minrow;
            sum = 0.;
            //EBORIN: 
            // Is this a hot spot?
            while(k < l) {
                sum += *elj-- * *ell-- * *(fElem[k++]);
            }
            *elj -= sum;
            if(ell != elj) *elj /= *ell;
            else if(IsZero(*elj)) {
                singular.push_back(l);
                *elj = 1.;
            }
            l++;
        }
        j++;
    }
    
    if(this->Rows() && IsZero(GetVal(this->Rows()-1,this->Rows()-1)))
    {
        singular.push_back(this->Rows()-1);
        PutVal(this->Rows()-1,this->Rows()-1,1.);
    }
    this->fDecomposed  = ELDLt;
    this->fDefPositive = 0;
    //if(Dim() > 100) cout << endl;
    return( 1 );
}